

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobject.cpp
# Opt level: O3

bool __thiscall
QMetaMethod::invokeImpl
          (QMetaMethod *this,QMetaMethod self,void *target,ConnectionType connectionType,
          qsizetype paramCount,void **parameters,char **typeNames,QMetaTypeInterface **metaTypes)

{
  uint uVar1;
  long lVar2;
  uint *puVar3;
  bool bVar4;
  InvokeFailReason IVar5;
  void *pvVar6;
  long in_FS_OFFSET;
  QMetaObject *in_stack_ffffffffffffff88;
  Data local_70;
  QMessageLogger local_60;
  QMetaMethod self_local;
  
  self_local.data.d = (uint *)self.mobj;
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  self_local.mobj = (QMetaObject *)this;
  if (this != (QMetaMethod *)0x0 && self.data.d.d != (uint *)0x0) {
    IVar5 = QMetaMethodInvoker::invokeImpl
                      ((QMetaMethodInvoker *)this,self,target,connectionType,paramCount,parameters,
                       typeNames,(QMetaTypeInterface **)in_stack_ffffffffffffff88);
    bVar4 = true;
    if (IVar5 == None) goto LAB_00282586;
    if (IVar5 < FormalParameterMismatch) {
      if (IVar5 == TooFewArguments) {
        local_60.context.version = 2;
        local_60.context._4_8_ = 0;
        local_60.context._12_8_ = 0;
        local_60.context.function._4_4_ = 0;
        local_60.context.category = "default";
        puVar3 = (this->data).d;
        uVar1 = puVar3[(long)*(int *)((long)&((this[1].mobj)->d).superdata.direct + 4) * 2];
        methodSignature((QByteArray *)&stack0xffffffffffffff88,&self_local);
        if (local_70.d == (uint *)0x0) {
          local_70.d = (uint *)&QByteArray::_empty;
        }
        QMessageLogger::warning
                  (&local_60,"QMetaMethod::invoke: too few arguments (%d) in call to %s::%s",
                   connectionType,(ulong)uVar1 + (long)puVar3,local_70.d);
        invokeImpl((QMetaMethod *)&stack0xffffffffffffff88);
      }
    }
    else {
      local_60.context.version = 2;
      local_60.context._4_8_ = 0;
      local_60.context._12_8_ = 0;
      local_60.context.function._4_4_ = 0;
      local_60.context.category = "default";
      pvVar6 = parameters[(uint)(IVar5 + (CouldNotQueueParameter|TooFewArguments))];
      if (pvVar6 == (void *)0x0) {
        pvVar6 = *(void **)(typeNames[(uint)(IVar5 + (CouldNotQueueParameter|TooFewArguments))] +
                           0x18);
      }
      puVar3 = (this->data).d;
      uVar1 = puVar3[(long)*(int *)((long)&((this[1].mobj)->d).superdata.direct + 4) * 2];
      methodSignature((QByteArray *)&stack0xffffffffffffff88,&self_local);
      if (local_70.d == (uint *)0x0) {
        local_70.d = (uint *)&QByteArray::_empty;
      }
      QMessageLogger::warning
                (&local_60,
                 "QMetaMethod::invoke: cannot convert formal parameter %d from %s in call to %s::%s"
                 ,(ulong)(uint)(IVar5 + CouldNotQueueParameter),pvVar6,(ulong)uVar1 + (long)puVar3,
                 local_70.d);
      invokeImpl((QMetaMethod *)&stack0xffffffffffffff88);
    }
  }
  bVar4 = false;
LAB_00282586:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool QMetaMethod::invokeImpl(QMetaMethod self, void *target, Qt::ConnectionType connectionType,
                             qsizetype paramCount, const void *const *parameters,
                             const char *const *typeNames,
                             const QtPrivate::QMetaTypeInterface *const *metaTypes)
{
    if (!target || !self.mobj)
        return false;
    QMetaMethodPrivate::InvokeFailReason r =
            QMetaMethodPrivate::invokeImpl(self, target, connectionType, paramCount, parameters,
                                           typeNames, metaTypes);
    if (Q_LIKELY(r == QMetaMethodPrivate::InvokeFailReason::None))
        return true;

    if (int(r) >= int(QMetaMethodPrivate::InvokeFailReason::FormalParameterMismatch)) {
        int n = int(r) - int(QMetaMethodPrivate::InvokeFailReason::FormalParameterMismatch);
        qWarning("QMetaMethod::invoke: cannot convert formal parameter %d from %s in call to %s::%s",
                 n, typeNames[n + 1] ? typeNames[n + 1] : metaTypes[n + 1]->name,
                 self.mobj->className(), self.methodSignature().constData());
    }
    if (r == QMetaMethodPrivate::InvokeFailReason::TooFewArguments) {
        qWarning("QMetaMethod::invoke: too few arguments (%d) in call to %s::%s",
                 int(paramCount), self.mobj->className(), self.methodSignature().constData());
    }
    return false;
}